

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator<<(char lhs,
          SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits
          )

{
  char cVar1;
  byte bVar2;
  int iVar3;
  char in_DIL;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  char local_4;
  char local_3;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_1;
  
  local_3 = in_DIL;
  cVar1 = SafeInt::operator_cast_to_char
                    ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if (cVar1 < '\0') {
    __assert_fail("!std::numeric_limits< T >::is_signed || (T)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x1b09,
                  "SafeInt<U, E> operator<<(U, SafeInt<T, E>) [T = char, U = signed char, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
                 );
  }
  cVar1 = SafeInt::operator_cast_to_char
                    ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if (cVar1 < '\b') {
    iVar3 = (int)local_3;
    bVar2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(iVar3,in_stack_fffffffffffffff0));
    local_4 = (char)(iVar3 << (bVar2 & 0x1f));
    SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_1,&local_4);
    return (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            )local_1.m_int;
  }
  __assert_fail("(T)bits < (int)safeint_internal::int_traits< U >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x1b0a,
                "SafeInt<U, E> operator<<(U, SafeInt<T, E>) [T = char, U = signed char, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< U, E > operator <<( U lhs, SafeInt< T, E > bits ) SAFEINT_NOTHROW
{
    ShiftAssert( !std::numeric_limits< T >::is_signed || (T)bits >= 0 );
    ShiftAssert( (T)bits < (int)safeint_internal::int_traits< U >::bitCount );

    return SafeInt< U, E >( (U)( lhs << (T)bits ) );
}